

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  long lVar2;
  Prog prog;
  Theme theme;
  ALLEGRO_FONT *font;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_FONT *in_stack_ffffffffffffec08;
  Prog *in_stack_ffffffffffffec10;
  Prog *in_stack_ffffffffffffed20;
  ALLEGRO_DISPLAY *in_stack_ffffffffffffed90;
  Theme *in_stack_ffffffffffffed98;
  Prog *in_stack_ffffffffffffeda0;
  
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init Allegro\n");
  }
  al_init_primitives_addon();
  al_install_keyboard();
  al_install_mouse();
  al_init_font_addon();
  al_init_ttf_addon();
  init_platform_specific();
  al_set_new_display_flags(0x40);
  lVar2 = al_create_display(0x2d0,0x1e0);
  if (lVar2 == 0) {
    abort_example("Unable to create display\n");
  }
  lVar2 = al_load_font("data/DejaVuSans.ttf",0xc,0);
  if (lVar2 == 0) {
    abort_example("Failed to load data/DejaVuSans.ttf\n");
  }
  Theme::Theme((Theme *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  Prog::Prog(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
  Prog::run(in_stack_ffffffffffffed20);
  Prog::~Prog(in_stack_ffffffffffffec10);
  al_destroy_font(lVar2);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_FONT *font;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();

   al_init_font_addon();
   al_init_ttf_addon();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(720, 480);
   if (!display) {
      abort_example("Unable to create display\n");
   }
   font = al_load_font("data/DejaVuSans.ttf", 12, 0);
   if (!font) {
      abort_example("Failed to load data/DejaVuSans.ttf\n");
   }

   /* Prog is destroyed at the end of this scope. */
   {
      Theme theme(font);
      Prog prog(theme, display);
      prog.run();
   }

   al_destroy_font(font);

   return 0;
}